

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O2

void __thiscall
kj::ExceptionSafeArrayUtil::construct
          (ExceptionSafeArrayUtil *this,size_t count,_func_void_void_ptr *constructElement)

{
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    (*constructElement)(this->pos);
    this->pos = this->pos + this->elementSize;
    this->constructedElementCount = this->constructedElementCount + 1;
  }
  return;
}

Assistant:

void ExceptionSafeArrayUtil::construct(size_t count, void (*constructElement)(void*)) {
  while (count > 0) {
    constructElement(pos);
    pos += elementSize;
    ++constructedElementCount;
    --count;
  }
}